

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * __thiscall
wasm::anon_unknown_0::TypePrinter::print
          (TypePrinter *this,Array *array,optional<wasm::HeapType> super)

{
  ostream *poVar1;
  char local_2b [3];
  
  std::__ostream_insert<char,std::char_traits<char>>(this->os,"(array",6);
  if (((undefined1  [16])
       super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_2b[2] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->os,local_2b + 2,1);
    print(this,&array->element);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"_subtype",8);
    local_2b[2] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->os,local_2b + 2,1);
    print(this,&array->element);
    local_2b[1] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->os,local_2b + 1,1);
    printHeapTypeName(this,super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
  }
  local_2b[0] = ')';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->os,local_2b,1);
  return poVar1;
}

Assistant:

std::ostream& TypePrinter::print(const Array& array,
                                 std::optional<HeapType> super) {
  os << "(array";
  if (super) {
    os << "_subtype";
  }
  os << ' ';
  print(array.element);
  if (super) {
    os << ' ';
    printHeapTypeName(*super);
  }
  return os << ')';
}